

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

GLFWvidmode * glfwGetVideoModes(GLFWmonitor *handle,int *count)

{
  GLFWbool GVar1;
  GLFWvidmode *pGVar2;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abhisarshukla[P]opengl-cmake-template/libs/glfw-3.3.4/src/monitor.c"
                  ,0x1ae,"const GLFWvidmode *glfwGetVideoModes(GLFWmonitor *, int *)");
  }
  if (count != (int *)0x0) {
    *count = 0;
    if (_glfw.initialized == 0) {
      pGVar2 = (GLFWvidmode *)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      GVar1 = refreshVideoModes((_GLFWmonitor *)handle);
      if (GVar1 == 0) {
        pGVar2 = (GLFWvidmode *)0x0;
      }
      else {
        *count = *(int *)(handle + 0x28);
        pGVar2 = *(GLFWvidmode **)(handle + 0x20);
      }
    }
    return pGVar2;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abhisarshukla[P]opengl-cmake-template/libs/glfw-3.3.4/src/monitor.c"
                ,0x1af,"const GLFWvidmode *glfwGetVideoModes(GLFWmonitor *, int *)");
}

Assistant:

GLFWAPI const GLFWvidmode* glfwGetVideoModes(GLFWmonitor* handle, int* count)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!refreshVideoModes(monitor))
        return NULL;

    *count = monitor->modeCount;
    return monitor->modes;
}